

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

bool __thiscall
tinyusdz::Attribute::get<std::array<unsigned_int,4ul>>
          (Attribute *this,double t,array<unsigned_int,_4UL> *dst,
          TimeSampleInterpolationType tinterp)

{
  undefined8 uVar1;
  bool bVar2;
  value_type *pvVar3;
  optional<std::array<unsigned_int,_4UL>_> v;
  optional<std::array<unsigned_int,_4UL>_> local_50;
  optional<std::array<unsigned_int,_4UL>_> local_3c;
  
  if (dst == (array<unsigned_int,_4UL> *)0x0) {
    return false;
  }
  if (NAN(t)) {
    bVar2 = primvar::PrimVar::has_value(&this->_var);
    if (bVar2) {
      primvar::PrimVar::get_value<std::array<unsigned_int,4ul>>(&local_50,&this->_var);
      local_3c.has_value_ = local_50.has_value_;
      if (local_50.has_value_ != false) {
        local_3c.contained._0_8_ = local_50.contained._0_8_;
        local_3c.contained._8_8_ = local_50.contained._8_8_;
        pvVar3 = nonstd::optional_lite::optional<std::array<unsigned_int,_4UL>_>::value(&local_3c);
        uVar1 = *(undefined8 *)(pvVar3->_M_elems + 2);
        *(undefined8 *)dst->_M_elems = *(undefined8 *)pvVar3->_M_elems;
        *(undefined8 *)(dst->_M_elems + 2) = uVar1;
        return true;
      }
    }
  }
  if ((this->_var)._ts._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->_var)._ts._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    bVar2 = get_value<std::array<unsigned_int,4ul>>(this,dst);
  }
  else {
    bVar2 = primvar::PrimVar::get_interpolated_value<std::array<unsigned_int,4ul>>
                      (&this->_var,t,tinterp,dst);
  }
  return bVar2;
}

Assistant:

bool get(const double t, T *dst,
           value::TimeSampleInterpolationType tinterp =
           value::TimeSampleInterpolationType::Linear) const {
    if (!dst) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {
      if (has_value()) {
        nonstd::optional<T> v = _var.get_value<T>();
        if (v) {
          (*dst) = v.value();
          return true;
        }
      }
    }

    if (has_timesamples()) {
      return _var.get_interpolated_value(t, tinterp, dst);
    }

    // try to get 'defaut' value
    return get_value(dst);
  }